

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VtabSavepoint(sqlite3 *db,int op,int iSavepoint)

{
  VTable *pVTab_00;
  sqlite3_module *psVar1;
  bool bVar2;
  _func_int_sqlite3_vtab_ptr_int *local_38;
  _func_int_sqlite3_vtab_ptr_int *xMethod;
  sqlite3_module *pMod;
  VTable *pVTab;
  int i;
  int rc;
  int iSavepoint_local;
  int op_local;
  sqlite3 *db_local;
  
  pVTab._4_4_ = 0;
  if (db->aVTrans != (VTable **)0x0) {
    pVTab._0_4_ = 0;
    while( true ) {
      bVar2 = false;
      if (pVTab._4_4_ == 0) {
        bVar2 = (int)pVTab < db->nVTrans;
      }
      if (!bVar2) break;
      pVTab_00 = db->aVTrans[(int)pVTab];
      psVar1 = pVTab_00->pMod->pModule;
      if ((pVTab_00->pVtab != (sqlite3_vtab *)0x0) && (1 < psVar1->iVersion)) {
        sqlite3VtabLock(pVTab_00);
        if (op == 0) {
          local_38 = psVar1->xSavepoint;
          pVTab_00->iSavepoint = iSavepoint + 1;
        }
        else if (op == 2) {
          local_38 = psVar1->xRollbackTo;
        }
        else {
          local_38 = psVar1->xRelease;
        }
        if ((local_38 != (_func_int_sqlite3_vtab_ptr_int *)0x0) &&
           (iSavepoint < pVTab_00->iSavepoint)) {
          pVTab._4_4_ = (*local_38)(pVTab_00->pVtab,iSavepoint);
        }
        sqlite3VtabUnlock(pVTab_00);
      }
      pVTab._0_4_ = (int)pVTab + 1;
    }
  }
  return pVTab._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3VtabSavepoint(sqlite3 *db, int op, int iSavepoint){
  int rc = SQLITE_OK;

  assert( op==SAVEPOINT_RELEASE||op==SAVEPOINT_ROLLBACK||op==SAVEPOINT_BEGIN );
  assert( iSavepoint>=-1 );
  if( db->aVTrans ){
    int i;
    for(i=0; rc==SQLITE_OK && i<db->nVTrans; i++){
      VTable *pVTab = db->aVTrans[i];
      const sqlite3_module *pMod = pVTab->pMod->pModule;
      if( pVTab->pVtab && pMod->iVersion>=2 ){
        int (*xMethod)(sqlite3_vtab *, int);
        sqlite3VtabLock(pVTab);
        switch( op ){
          case SAVEPOINT_BEGIN:
            xMethod = pMod->xSavepoint;
            pVTab->iSavepoint = iSavepoint+1;
            break;
          case SAVEPOINT_ROLLBACK:
            xMethod = pMod->xRollbackTo;
            break;
          default:
            xMethod = pMod->xRelease;
            break;
        }
        if( xMethod && pVTab->iSavepoint>iSavepoint ){
          rc = xMethod(pVTab->pVtab, iSavepoint);
        }
        sqlite3VtabUnlock(pVTab);
      }
    }
  }
  return rc;
}